

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QName.cpp
# Opt level: O1

bool __thiscall xercesc_4_0::QName::operator==(QName *this,QName *qname)

{
  short *psVar1;
  short *psVar2;
  XMLCh *pXVar3;
  XMLCh *pXVar4;
  long lVar5;
  
  pXVar3 = this->fLocalPart;
  if (this->fPrefix == (XMLCh *)0x0 && pXVar3 == (XMLCh *)0x0) {
    return qname->fPrefix == (XMLCh *)0x0 && qname->fLocalPart == (XMLCh *)0x0;
  }
  if (this->fURIId == 0) {
    pXVar3 = getRawName(this);
    pXVar4 = getRawName(qname);
    if (pXVar3 == pXVar4) {
      return true;
    }
    if (pXVar4 != (XMLCh *)0x0 && pXVar3 != (XMLCh *)0x0) {
      lVar5 = 0;
      do {
        psVar1 = (short *)((long)pXVar3 + lVar5);
        if (*psVar1 == 0) {
          return *(short *)((long)pXVar4 + lVar5) == 0;
        }
        psVar2 = (short *)((long)pXVar4 + lVar5);
        lVar5 = lVar5 + 2;
      } while (*psVar1 == *psVar2);
      return false;
    }
    if (pXVar3 != (XMLCh *)0x0) {
      if (*pXVar3 != L'\0' || pXVar4 == (XMLCh *)0x0) {
        return *pXVar3 == L'\0';
      }
      goto LAB_0023df09;
    }
  }
  else {
    if (this->fURIId != qname->fURIId) {
      return false;
    }
    pXVar4 = qname->fLocalPart;
    if (pXVar3 == pXVar4) {
      return true;
    }
    if (pXVar4 != (XMLCh *)0x0 && pXVar3 != (XMLCh *)0x0) {
      lVar5 = 0;
      do {
        psVar1 = (short *)((long)pXVar3 + lVar5);
        if (*psVar1 == 0) {
          return *(short *)((long)pXVar4 + lVar5) == 0;
        }
        psVar2 = (short *)((long)pXVar4 + lVar5);
        lVar5 = lVar5 + 2;
      } while (*psVar1 == *psVar2);
      return false;
    }
    if (pXVar3 != (XMLCh *)0x0) {
      if (*pXVar3 != L'\0' || pXVar4 == (XMLCh *)0x0) {
        return *pXVar3 == L'\0';
      }
      goto LAB_0023df09;
    }
  }
  if (pXVar4 == (XMLCh *)0x0) {
    return true;
  }
LAB_0023df09:
  return *pXVar4 == L'\0';
}

Assistant:

bool QName::operator==(const QName& qname) const
{
    // if we are an unitialized QName, check that the other is unitialized too
    if (!fLocalPart && !fPrefix)
        return !qname.fLocalPart && !qname.fPrefix;

    if (fURIId == 0) // null URI
        return (XMLString::equals(getRawName(),qname.getRawName()));

    return ((fURIId == qname.getURI()) &&
           (XMLString::equals(fLocalPart, qname.getLocalPart())));
}